

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlBufGetNodeContent(xmlBufPtr buf,xmlNode *cur)

{
  xmlEntityPtr pxVar1;
  xmlNode *local_48;
  xmlNodePtr tmp_2;
  xmlEntityPtr ent;
  xmlNodePtr tmp_1;
  xmlAttrPtr attr;
  xmlNode *tmp;
  xmlNode *cur_local;
  xmlBufPtr buf_local;
  
  if ((cur == (xmlNode *)0x0) || (buf == (xmlBufPtr)0x0)) {
    buf_local._4_4_ = -1;
  }
  else {
    switch(cur->type) {
    case XML_ELEMENT_NODE:
    case XML_DOCUMENT_FRAG_NODE:
      attr = (xmlAttrPtr)cur;
LAB_001c0574:
      if (attr != (xmlAttrPtr)0x0) {
        if (attr->type - XML_TEXT_NODE < 2) {
          if (*(long *)&attr->atype != 0) {
            xmlBufCat(buf,*(xmlChar **)&attr->atype);
          }
        }
        else if (attr->type == XML_ENTITY_REF_NODE) {
          xmlBufGetNodeContent(buf,(xmlNode *)attr);
        }
        if ((attr->children == (_xmlNode *)0x0) || (attr->children->type == XML_ENTITY_DECL)) {
          if ((xmlNode *)attr == cur) break;
          if (attr->next == (_xmlAttr *)0x0) {
            do {
              attr = (xmlAttrPtr)attr->parent;
              if ((xmlNode *)attr == (xmlNode *)0x0) break;
              if ((xmlNode *)attr == cur) {
                attr = (xmlAttrPtr)0x0;
                break;
              }
              if (((xmlNode *)attr)->next != (_xmlNode *)0x0) {
                attr = (xmlAttrPtr)((xmlNode *)attr)->next;
                break;
              }
            } while ((xmlNode *)attr != (xmlNode *)0x0);
          }
          else {
            attr = attr->next;
          }
        }
        else {
          attr = (xmlAttrPtr)attr->children;
        }
        goto LAB_001c0574;
      }
      break;
    case XML_ATTRIBUTE_NODE:
      for (ent = (xmlEntityPtr)cur->children; ent != (xmlEntityPtr)0x0;
          ent = (xmlEntityPtr)ent->next) {
        if (ent->type == XML_TEXT_NODE) {
          xmlBufCat(buf,ent->content);
        }
        else {
          xmlBufGetNodeContent(buf,(xmlNode *)ent);
        }
      }
      break;
    case XML_TEXT_NODE:
    case XML_CDATA_SECTION_NODE:
      xmlBufCat(buf,cur->content);
      break;
    case XML_ENTITY_REF_NODE:
      pxVar1 = xmlGetDocEntity(cur->doc,cur->name);
      if (pxVar1 == (xmlEntityPtr)0x0) {
        return -1;
      }
      for (local_48 = pxVar1->children; local_48 != (xmlNode *)0x0; local_48 = local_48->next) {
        xmlBufGetNodeContent(buf,local_48);
      }
      break;
    case XML_ENTITY_NODE:
    case XML_DOCUMENT_TYPE_NODE:
    case XML_NOTATION_NODE:
    case XML_DTD_NODE:
    case XML_XINCLUDE_START:
    case XML_XINCLUDE_END:
      break;
    case XML_PI_NODE:
    case XML_COMMENT_NODE:
      xmlBufCat(buf,cur->content);
      break;
    case XML_DOCUMENT_NODE:
    case XML_HTML_DOCUMENT_NODE:
      for (tmp = cur->children; tmp != (xmlNode *)0x0; tmp = tmp->next) {
        if (((tmp->type == XML_ELEMENT_NODE) || (tmp->type == XML_TEXT_NODE)) ||
           (tmp->type == XML_CDATA_SECTION_NODE)) {
          xmlBufGetNodeContent(buf,tmp);
        }
      }
      break;
    case XML_ELEMENT_DECL:
    case XML_ATTRIBUTE_DECL:
    case XML_ENTITY_DECL:
      break;
    case XML_NAMESPACE_DECL:
      xmlBufCat(buf,cur->name);
    }
    buf_local._4_4_ = 0;
  }
  return buf_local._4_4_;
}

Assistant:

int
xmlBufGetNodeContent(xmlBufPtr buf, const xmlNode *cur)
{
    if ((cur == NULL) || (buf == NULL)) return(-1);
    switch (cur->type) {
        case XML_CDATA_SECTION_NODE:
        case XML_TEXT_NODE:
	    xmlBufCat(buf, cur->content);
            break;
        case XML_DOCUMENT_FRAG_NODE:
        case XML_ELEMENT_NODE:{
                const xmlNode *tmp = cur;

                while (tmp != NULL) {
                    switch (tmp->type) {
                        case XML_CDATA_SECTION_NODE:
                        case XML_TEXT_NODE:
                            if (tmp->content != NULL)
                                xmlBufCat(buf, tmp->content);
                            break;
                        case XML_ENTITY_REF_NODE:
                            xmlBufGetNodeContent(buf, tmp);
                            break;
                        default:
                            break;
                    }
                    /*
                     * Skip to next node
                     */
                    if (tmp->children != NULL) {
                        if (tmp->children->type != XML_ENTITY_DECL) {
                            tmp = tmp->children;
                            continue;
                        }
                    }
                    if (tmp == cur)
                        break;

                    if (tmp->next != NULL) {
                        tmp = tmp->next;
                        continue;
                    }

                    do {
                        tmp = tmp->parent;
                        if (tmp == NULL)
                            break;
                        if (tmp == cur) {
                            tmp = NULL;
                            break;
                        }
                        if (tmp->next != NULL) {
                            tmp = tmp->next;
                            break;
                        }
                    } while (tmp != NULL);
                }
		break;
            }
        case XML_ATTRIBUTE_NODE:{
                xmlAttrPtr attr = (xmlAttrPtr) cur;
		xmlNodePtr tmp = attr->children;

		while (tmp != NULL) {
		    if (tmp->type == XML_TEXT_NODE)
		        xmlBufCat(buf, tmp->content);
		    else
		        xmlBufGetNodeContent(buf, tmp);
		    tmp = tmp->next;
		}
                break;
            }
        case XML_COMMENT_NODE:
        case XML_PI_NODE:
	    xmlBufCat(buf, cur->content);
            break;
        case XML_ENTITY_REF_NODE:{
                xmlEntityPtr ent;
                xmlNodePtr tmp;

                /* lookup entity declaration */
                ent = xmlGetDocEntity(cur->doc, cur->name);
                if (ent == NULL)
                    return(-1);

                /* an entity content can be any "well balanced chunk",
                 * i.e. the result of the content [43] production:
                 * http://www.w3.org/TR/REC-xml#NT-content
                 * -> we iterate through child nodes and recursive call
                 * xmlNodeGetContent() which handles all possible node types */
                tmp = ent->children;
                while (tmp) {
		    xmlBufGetNodeContent(buf, tmp);
                    tmp = tmp->next;
                }
		break;
            }
        case XML_ENTITY_NODE:
        case XML_DOCUMENT_TYPE_NODE:
        case XML_NOTATION_NODE:
        case XML_DTD_NODE:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
            break;
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
	    cur = cur->children;
	    while (cur!= NULL) {
		if ((cur->type == XML_ELEMENT_NODE) ||
		    (cur->type == XML_TEXT_NODE) ||
		    (cur->type == XML_CDATA_SECTION_NODE)) {
		    xmlBufGetNodeContent(buf, cur);
		}
		cur = cur->next;
	    }
	    break;
        case XML_NAMESPACE_DECL:
	    xmlBufCat(buf, ((xmlNsPtr) cur)->href);
	    break;
        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
            break;
    }
    return(0);
}